

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

uint * __thiscall r_code::vector<unsigned_int>::operator[](vector<unsigned_int> *this,size_t i)

{
  size_t sVar1;
  reference pvVar2;
  size_t i_local;
  vector<unsigned_int> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->m_vector,i + 1);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(&this->m_vector,i);
  return pvVar2;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }